

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Base32Encoding.cpp
# Opt level: O2

size_t axl::enc::Base32Encoding::encode(String *string,void *p,size_t size,uint_t flags)

{
  long lVar1;
  C *pCVar2;
  ulong uVar3;
  size_t length;
  C *pCVar4;
  char *pcVar5;
  uint uVar6;
  size_t i;
  ulong uVar7;
  byte *pbVar8;
  bool bVar9;
  
  if (size == 0) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear(string);
    length = 0;
  }
  else {
    lVar1 = ((size * 8) / 5 + 1) - (ulong)((size * 8) % 5 == 0);
    uVar3 = (ulong)(-(int)lVar1 & 7);
    if ((flags & 1) != 0) {
      uVar3 = 0;
    }
    length = uVar3 + lVar1;
    if ((flags & 2) != 0) {
      length = ((length >> 6) + length) - (ulong)((length & 0xfc0) == 0);
    }
    pCVar2 = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::createBuffer
                       (string,length,false);
    if (pCVar2 == (C *)0x0) {
      length = 0xffffffffffffffff;
    }
    else {
      pbVar8 = (byte *)(size + (long)p);
      uVar6 = 0;
      if ((flags & 2) == 0) {
        uVar3 = 0;
        pCVar4 = pCVar2;
        for (; p < pbVar8; p = (void *)((long)p + 1)) {
          uVar6 = (uint)*p | uVar6 << 8;
          uVar3 = uVar3 + 8;
          while (4 < uVar3) {
            uVar3 = uVar3 - 5;
            *pCVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[uVar6 >> ((byte)uVar3 & 0x1f) & 0x1f];
            pCVar4 = pCVar4 + 1;
          }
        }
        if (uVar3 != 0) {
          *pCVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[uVar6 << (5U - (char)uVar3 & 0x1f) & 0x1f];
          pCVar4 = pCVar4 + 1;
        }
        for (; pCVar4 < pCVar2 + length; pCVar4 = pCVar4 + 1) {
          *pCVar4 = '=';
        }
      }
      else {
        uVar3 = 0;
        uVar7 = 0;
        pCVar4 = pCVar2;
        for (; p < pbVar8; p = (void *)((long)p + 1)) {
          uVar6 = (uint)*p | uVar6 << 8;
          uVar3 = uVar3 + 8;
          while (4 < uVar3) {
            bVar9 = (uVar7 & 0x3f) == 0;
            if (bVar9) {
              *pCVar4 = '\n';
            }
            uVar3 = uVar3 - 5;
            pcVar5 = pCVar4 + bVar9;
            pCVar4 = pcVar5 + 1;
            *pcVar5 = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[uVar6 >> ((byte)uVar3 & 0x1f) & 0x1f];
            uVar7 = uVar7 + 1;
          }
        }
        if (uVar3 != 0) {
          *pCVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[uVar6 << (5U - (char)uVar3 & 0x1f) & 0x1f];
          pCVar4 = pCVar4 + 1;
        }
        for (; pCVar4 < pCVar2 + length; pCVar4 = pCVar4 + 1) {
          *pCVar4 = '=';
        }
      }
    }
  }
  return length;
}

Assistant:

size_t
Base32Encoding::encode(
	sl::String* string,
	const void* p,
	size_t size,
	uint_t flags
) {
	if (!size) {
		string->clear();
		return 0;
	}

	size_t bitCount = size * 8;
	size_t length = bitCount / 5;
	if (bitCount % 5)
		length++;

	if (!(flags & Base32EncodingFlag_NoPadding))
		length += 7 - ((length - 1) & 7);

	if (flags & Base32EncodingFlag_Multiline) {
		size_t lineCount = length / 64;
		if (lineCount & 0x3f)
			lineCount++;

		length += lineCount - 1;
	}

	char* dst = string->createBuffer(length);
	if (!dst)
		return -1;

	if (flags & Base32EncodingFlag_Multiline)
		encodeImpl<GetBase32Char, InsertNl>(dst, length, (uchar_t*)p, size);
	else
		encodeImpl<GetBase32Char, InsertNoNl>(dst, length, (uchar_t*)p, size);

	return length;
}